

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  uv_loop_t *unaff_RBX;
  uv_timer_t *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_c0 [120];
  uv_loop_t *puStack_48;
  code *pcStack_40;
  void *pvStack_38;
  undefined1 auStack_30 [16];
  undefined8 uStack_20;
  uv__queue *local_18;
  uv__queue *local_10;
  
  uStack_20._0_4_ = 0x1d6c2e;
  uStack_20._4_4_ = 0;
  uVar2 = uv_default_loop();
  uStack_20._0_4_ = 0x1d6c3d;
  uStack_20._4_4_ = 0;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  local_10 = (uv__queue *)(long)iVar1;
  local_18 = (uv__queue *)0x0;
  if (local_10 == (uv__queue *)0x0) {
    uStack_20._0_4_ = 0x1d6c60;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d6c6f;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6e7a;
    uStack_20._0_4_ = 0x1d6c92;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d6ca1;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer2);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6e87;
    uStack_20._0_4_ = 0x1d6cd9;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6e94;
    unaff_RBX = (uv_loop_t *)0xffffffffffff;
    uStack_20._0_4_ = 0x1d6d19;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6ea1;
    uStack_20._0_4_ = 0x1d6d53;
    uStack_20._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6eae;
    local_10 = (uv__queue *)0x1;
    uStack_20._0_4_ = 0x1d6d86;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if (local_10 != local_18) goto LAB_001d6ebb;
    local_10 = (uv__queue *)0xffffffffffff;
    uStack_20._0_4_ = 0x1d6daa;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if (local_10 != local_18) goto LAB_001d6ec8;
    local_10 = (uv__queue *)0x0;
    uStack_20._0_4_ = 0x1d6dd2;
    uStack_20._4_4_ = 0;
    local_18 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (local_18 < local_10) goto LAB_001d6ed5;
    uStack_20._0_4_ = 0x1d6dea;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d6df4;
    uStack_20._4_4_ = 0;
    iVar1 = uv_run(uVar2,0);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 != (uv__queue *)0x0) goto LAB_001d6ee2;
    uStack_20._0_4_ = 0x1d6e17;
    uStack_20._4_4_ = 0;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    uStack_20._0_4_ = 0x1d6e2b;
    uStack_20._4_4_ = 0;
    uv_walk(unaff_RBX,close_walk_cb,0);
    uStack_20._0_4_ = 0x1d6e35;
    uStack_20._4_4_ = 0;
    uv_run(unaff_RBX,0);
    local_10 = (uv__queue *)0x0;
    uStack_20._0_4_ = 0x1d6e43;
    uStack_20._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_20._0_4_ = 0x1d6e4b;
    uStack_20._4_4_ = 0;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (uv__queue *)(long)iVar1;
    if (local_10 == local_18) {
      uStack_20._0_4_ = 0x1d6e65;
      uStack_20._4_4_ = 0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStack_20._0_4_ = 0x1d6e7a;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d6e7a:
    uStack_20._0_4_ = 0x1d6e87;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d6e87:
    uStack_20._0_4_ = 0x1d6e94;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d6e94:
    uStack_20._0_4_ = 0x1d6ea1;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d6ea1:
    uStack_20._0_4_ = 0x1d6eae;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d6eae:
    uStack_20._0_4_ = 0x1d6ebb;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d6ebb:
    uStack_20._0_4_ = 0x1d6ec8;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d6ec8:
    uStack_20._0_4_ = 0x1d6ed5;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d6ed5:
    uStack_20._0_4_ = 0x1d6ee2;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d6ee2:
    uStack_20._0_4_ = 0x1d6eef;
    uStack_20._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar3 = (uv_timer_t *)&stack0xfffffffffffffff0;
  uStack_20 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar3 == &tiny_timer) {
    auStack_30._8_8_ = (uv_loop_t *)0x1d6f17;
    uv_close(&tiny_timer,0);
    auStack_30._8_8_ = (uv_loop_t *)0x1d6f25;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  auStack_30._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_40 = (code *)0x1d6f43;
  auStack_30._8_8_ = unaff_RBX;
  uVar2 = uv_default_loop();
  pcStack_40 = (code *)0x1d6f52;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_30._0_8_ = SEXT48(iVar1);
  pvStack_38 = (void *)0x0;
  if ((void *)auStack_30._0_8_ == (void *)0x0) {
    pcStack_40 = (code *)0x1d6f75;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d6f84;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d70ab;
    pcStack_40 = (code *)0x1d6fbf;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d70b8;
    pcStack_40 = (code *)0x1d6ffc;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d70c5;
    pcStack_40 = (code *)0x1d701f;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d7029;
    iVar1 = uv_run(uVar2,0);
    auStack_30._0_8_ = SEXT48(iVar1);
    pvStack_38 = (void *)0x0;
    if ((void *)auStack_30._0_8_ != (void *)0x0) goto LAB_001d70d2;
    pcStack_40 = (code *)0x1d704c;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    pcStack_40 = (code *)0x1d7060;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_40 = (code *)0x1d706a;
    uv_run(unaff_RBX,0);
    auStack_30._0_8_ = (void *)0x0;
    pcStack_40 = (code *)0x1d7078;
    uVar2 = uv_default_loop();
    pcStack_40 = (code *)0x1d7080;
    iVar1 = uv_loop_close(uVar2);
    pvStack_38 = (void *)(long)iVar1;
    if ((void *)auStack_30._0_8_ == pvStack_38) {
      pcStack_40 = (code *)0x1d7096;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_40 = (code *)0x1d70ab;
    run_test_timer_huge_repeat_cold_1();
LAB_001d70ab:
    pcStack_40 = (code *)0x1d70b8;
    run_test_timer_huge_repeat_cold_2();
LAB_001d70b8:
    pcStack_40 = (code *)0x1d70c5;
    run_test_timer_huge_repeat_cold_3();
LAB_001d70c5:
    pcStack_40 = (code *)0x1d70d2;
    run_test_timer_huge_repeat_cold_4();
LAB_001d70d2:
    pcStack_40 = (code *)0x1d70df;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar3 = (uv_timer_t *)auStack_30;
  pcStack_40 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_40._0_4_ = extraout_EAX;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar3 == &tiny_timer) goto LAB_001d7114;
    puStack_48 = (uv_loop_t *)0x1d7108;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_00;
  }
  if (puVar3 == &huge_timer1) {
LAB_001d7114:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls == 10) {
      puStack_48 = (uv_loop_t *)0x1d712f;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    return (int)pcStack_40;
  }
  puStack_48 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_48 = unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d7345;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7354;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d7363;
    iVar1 = uv_timer_start(auStack_c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d7372;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7381;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d7390;
    uv_close(auStack_c0,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d73ae;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d7345:
    run_test_timer_run_once_cold_2();
LAB_001d7354:
    run_test_timer_run_once_cold_3();
LAB_001d7363:
    run_test_timer_run_once_cold_4();
LAB_001d7372:
    run_test_timer_run_once_cold_5();
LAB_001d7381:
    run_test_timer_run_once_cold_6();
LAB_001d7390:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d73ae:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT_OK(uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT_OK(uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT_OK(uv_timer_start(&huge_timer1,
                           tiny_timer_cb,
                           0xffffffffffffLL,
                           0));
  ASSERT_OK(uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT_UINT64_EQ(1, uv_timer_get_due_in(&tiny_timer));
  ASSERT_UINT64_EQ(281474976710655, uv_timer_get_due_in(&huge_timer1));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&huge_timer2));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}